

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_write_uvector(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  byte bVar1;
  char cVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  double dVar6;
  undefined1 x [16];
  undefined1 x_00 [16];
  sexp psVar7;
  ulong uVar8;
  sexp psVar9;
  sexp extraout_RDX;
  sexp extraout_RDX_00;
  sexp psVar10;
  undefined1 *extraout_RDX_01;
  undefined1 *extraout_RDX_02;
  undefined1 *extraout_RDX_03;
  undefined1 *extraout_RDX_04;
  undefined1 *extraout_RDX_05;
  sexp extraout_RDX_06;
  sexp extraout_RDX_07;
  undefined1 *extraout_RDX_08;
  undefined1 *extraout_RDX_09;
  undefined1 *extraout_RDX_10;
  undefined1 *n_00;
  sexp extraout_RDX_11;
  sexp extraout_RDX_12;
  sexp extraout_RDX_13;
  sexp extraout_RDX_14;
  undefined1 *extraout_RDX_15;
  undefined1 *extraout_RDX_16;
  long lVar11;
  sexp f;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  undefined8 in_stack_ffffffffffffff88;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_58.var = (sexp_conflict *)&stack0xffffffffffffff90;
  local_48.next = &local_58;
  local_48.var = &local_68;
  local_68 = (sexp)&DAT_0000043e;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  psVar7 = sexp_make_flonum(ctx,0.0);
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x23,(FILE *)(out->value).type.getters);
  }
  else {
    psVar10 = (out->value).type.print;
    if (psVar10 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar10->tag + 1);
      *(undefined1 *)((long)&psVar10->tag + (long)&psVar3->tag) = 0x23;
    }
    else {
      sexp_buffered_write_char(ctx,0x23,out);
    }
  }
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc((uint)"#ususususuffccff"[(obj->value).uvector.element_type],
         (FILE *)(out->value).type.getters);
    psVar10 = extraout_RDX;
  }
  else {
    psVar10 = (out->value).type.print;
    bVar1 = "#ususususuffccff"[(obj->value).uvector.element_type];
    if (psVar10 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar10->tag + 1);
      *(byte *)((long)&psVar10->tag + (long)&psVar3->tag) = bVar1;
    }
    else {
      sexp_buffered_write_char(ctx,(uint)bVar1,out);
      psVar10 = extraout_RDX_00;
    }
  }
  sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar10,
                (sexp)((ulong)""[(obj->value).uvector.element_type] * 2 + 1),out);
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x28,(FILE *)(out->value).type.getters);
    n_00 = extraout_RDX_01;
  }
  else {
    psVar10 = (out->value).type.print;
    if (psVar10 < (sexp)(out->value).port.size) {
      n_00 = (undefined1 *)((long)&psVar10->tag + 1);
      (out->value).port.offset = (sexp_uint_t)n_00;
      *(undefined1 *)((long)&psVar10->tag + (long)&psVar3->tag) = 0x28;
    }
    else {
      sexp_buffered_write_char(ctx,0x28,out);
      n_00 = extraout_RDX_02;
    }
  }
  local_60 = (obj->value).type.slots;
  if (local_60 != (sexp)0x0) {
    psVar3 = (obj->value).type.name;
    lVar11 = 0;
    psVar10 = (sexp)0x0;
    do {
      if (psVar10 != (sexp)0x0) {
        psVar9 = (out->value).type.setters;
        if (psVar9 == (sexp)0x0) {
          putc(0x20,(FILE *)(out->value).type.getters);
          n_00 = extraout_RDX_03;
        }
        else {
          uVar8 = (out->value).port.offset;
          if (uVar8 < (out->value).port.size) {
            n_00 = (undefined1 *)(uVar8 + 1);
            (out->value).port.offset = (sexp_uint_t)n_00;
            *(undefined1 *)((long)&psVar9->tag + uVar8) = 0x20;
          }
          else {
            sexp_buffered_write_char(ctx,0x20,out);
            n_00 = extraout_RDX_04;
          }
        }
      }
      psVar9 = psVar7;
      switch((obj->value).flonum_bits[8]) {
      case '\x01':
        psVar9 = (sexp)(ulong)(((uint)(int)(((obj->value).type.name)->value).flonum_bits
                                           [((ulong)psVar10 >> 3) + 8] >> ((byte)psVar10 & 7) & 1) *
                               2 + 1);
        goto LAB_0010ddd2;
      case '\x02':
        uVar8 = (ulong)((psVar3->value).flonum_bits + 8)[(long)psVar10];
        goto LAB_0010dd5a;
      default:
        goto switchD_0010dc0e_caseD_3;
      case '\x04':
        uVar8 = (ulong)*(short *)((long)&psVar3->value + (long)psVar10 * 2 + 8);
        goto LAB_0010dd5a;
      case '\x05':
        uVar8 = (ulong)*(ushort *)((long)&psVar3->value + (long)psVar10 * 2 + 8);
LAB_0010dd5a:
        psVar9 = (sexp)(uVar8 * 2 + 1);
        goto LAB_0010ddd2;
      case '\x06':
        goto LAB_0010dd70;
      case '\a':
        goto LAB_0010dd7f;
      case '\b':
LAB_0010dd70:
        x._8_8_ = psVar7;
        x._0_8_ = in_stack_ffffffffffffff88;
        psVar9 = sexp_make_integer(ctx,(sexp_lsint_t)x);
        n_00 = extraout_RDX_08;
        local_68 = psVar9;
        goto LAB_0010ddd2;
      case '\t':
LAB_0010dd7f:
        x_00._8_8_ = psVar7;
        x_00._0_8_ = in_stack_ffffffffffffff88;
        psVar9 = sexp_make_unsigned_integer(ctx,(sexp_luint_t)x_00);
        n_00 = extraout_RDX_09;
        local_68 = psVar9;
        goto LAB_0010ddd2;
      case '\n':
        dVar6 = (double)*(float *)((long)&psVar3->value + (long)psVar10 * 4 + 8);
        break;
      case '\v':
        dVar6 = *(double *)((long)&psVar3->value + (long)psVar10 * 8 + 8);
        break;
      case '\f':
        (psVar7->value).flonum = (double)*(float *)((long)&psVar3->value + (long)psVar10 * 8 + 8);
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar7,out);
        psVar9 = extraout_RDX_06;
        if (0.0 <= *(float *)((long)&psVar3->value + (long)psVar10 * 8 + 0xc)) {
          psVar4 = (out->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(0x2b,(FILE *)(out->value).type.getters);
            psVar9 = extraout_RDX_11;
          }
          else {
            psVar5 = (out->value).type.print;
            if (psVar5 < (sexp)(out->value).port.size) {
              psVar9 = (sexp)((long)&psVar5->tag + 1);
              (out->value).type.print = psVar9;
              *(undefined1 *)((long)&psVar5->tag + (long)&psVar4->tag) = 0x2b;
            }
            else {
              sexp_buffered_write_char(ctx,0x2b,out);
              psVar9 = extraout_RDX_13;
            }
          }
        }
        dVar6 = (double)*(float *)((long)&psVar3->value + (long)psVar10 * 8 + 0xc);
        goto LAB_0010de44;
      case '\r':
        (psVar7->value).flonum = *(double *)((long)&psVar3->value + lVar11 + 8);
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar7,out);
        psVar9 = extraout_RDX_07;
        if (0.0 <= *(double *)((long)&psVar3->value + lVar11 + 0x10)) {
          psVar4 = (out->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(0x2b,(FILE *)(out->value).type.getters);
            psVar9 = extraout_RDX_12;
          }
          else {
            psVar5 = (out->value).type.print;
            if (psVar5 < (sexp)(out->value).port.size) {
              psVar9 = (sexp)((long)&psVar5->tag + 1);
              (out->value).type.print = psVar9;
              *(undefined1 *)((long)&psVar5->tag + (long)&psVar4->tag) = 0x2b;
            }
            else {
              sexp_buffered_write_char(ctx,0x2b,out);
              psVar9 = extraout_RDX_14;
            }
          }
        }
        dVar6 = *(double *)((long)&psVar3->value + lVar11 + 0x10);
LAB_0010de44:
        (psVar7->value).flonum = dVar6;
        sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar9,psVar7,out);
        psVar9 = (out->value).type.setters;
        if (psVar9 == (sexp)0x0) {
          putc(0x69,(FILE *)(out->value).type.getters);
          n_00 = extraout_RDX_15;
        }
        else {
          psVar4 = (out->value).type.print;
          if (psVar4 < (sexp)(out->value).port.size) {
            n_00 = (undefined1 *)((long)&psVar4->tag + 1);
            (out->value).port.offset = (sexp_uint_t)n_00;
            *(undefined1 *)((long)&psVar4->tag + (long)&psVar9->tag) = 0x69;
          }
          else {
            sexp_buffered_write_char(ctx,0x69,out);
            n_00 = extraout_RDX_16;
          }
        }
        goto switchD_0010dc0e_caseD_3;
      case '\x0e':
        cVar2 = ((psVar3->value).flonum_bits + 8)[(long)psVar10];
        if ((long)cVar2 < 0) {
          dVar6 = -sexp_quarters[(int)cVar2 & 0x7f];
        }
        else {
          dVar6 = sexp_quarters[cVar2];
        }
        break;
      case '\x0f':
        dVar6 = sexp_half_to_double(*(unsigned_short *)
                                     ((long)&psVar3->value + (long)psVar10 * 2 + 8));
        n_00 = extraout_RDX_05;
        psVar9 = psVar7;
      }
      (psVar9->value).flonum = dVar6;
      psVar7 = psVar9;
LAB_0010ddd2:
      sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar9,out);
      n_00 = extraout_RDX_10;
switchD_0010dc0e_caseD_3:
      psVar10 = (sexp)((long)&psVar10->tag + 1);
      lVar11 = lVar11 + 0x10;
    } while (local_60 != psVar10);
  }
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x29,(FILE *)(out->value).type.getters);
  }
  else {
    psVar7 = (out->value).type.print;
    if (psVar7 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar7->tag + 1);
      *(undefined1 *)((long)&psVar7->tag + (long)&psVar3->tag) = 0x29;
    }
    else {
      sexp_buffered_write_char(ctx,0x29,out);
    }
  }
  (ctx->value).context.saves = local_58.next;
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_write_uvector(sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp_uint_t i, len;
  char* str;
  sexp_gc_var2(f, tmp);
  sexp_gc_preserve2(ctx, f, tmp);
  f = sexp_make_flonum(ctx, 0.0f);
  sexp_write_char(ctx, '#', out);
  sexp_write_char(ctx, sexp_uvector_prefix(sexp_uvector_type(obj)), out);
  sexp_write(ctx, sexp_make_fixnum(sexp_uvector_element_size(sexp_uvector_type(obj))), out);
  sexp_write_char(ctx, '(', out);
  len = sexp_uvector_length(obj);
  str = (char*) sexp_uvector_data(obj);
  for (i=0; i<(sexp_sint_t)len; i++) {
    if (i!=0) sexp_write_char(ctx, ' ', out);
    switch (sexp_uvector_type(obj)) {
    case SEXP_U1: sexp_write(ctx, sexp_make_fixnum(sexp_bit_ref(obj, i)), out); break;
    case SEXP_S8: sexp_write(ctx, sexp_make_fixnum(((signed char*)str)[i]), out); break;
    case SEXP_S16: sexp_write(ctx, sexp_make_fixnum(((signed short*)str)[i]), out); break;
    case SEXP_U16: sexp_write(ctx, sexp_make_fixnum(((unsigned short*)str)[i]), out); break;
    case SEXP_S32: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int32_t*)str)[i]), out); break;
    case SEXP_U32: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint32_t*)str)[i]), out); break;
    case SEXP_S64: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int64_t*)str)[i]), out); break;
    case SEXP_U64: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint64_t*)str)[i]), out); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
    case SEXP_F8: sexp_flonum_value_set(f, sexp_quarter_to_double(((unsigned char*)str)[i])); sexp_write(ctx, f, out); break;
    case SEXP_F16: sexp_flonum_value_set(f, sexp_half_to_double(((unsigned short*)str)[i])); sexp_write(ctx, f, out); break;
#endif
    case SEXP_F32: sexp_flonum_value_set(f, ((float*)str)[i]); sexp_write(ctx, f, out); break;
    case SEXP_F64: sexp_flonum_value_set(f, ((double*)str)[i]); sexp_write(ctx, f, out); break;
#endif
#if SEXP_USE_COMPLEX
    case SEXP_C64:
      sexp_flonum_value_set(f, ((float*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((float*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((float*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
    case SEXP_C128:
      sexp_flonum_value_set(f, ((double*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((double*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((double*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
#endif
    }
  }
  sexp_write_char(ctx, ')', out);
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}